

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMU_KDF_SCHEME_Unmarshal(TPMU_KDF_SCHEME *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  TPMU_KDF_SCHEME TVar2;
  
  if ((int)selector < 0x20) {
    if (selector == 7) {
LAB_001083b5:
      iVar1 = *size;
      *size = iVar1 + -2;
      if (iVar1 < 2) {
        return 0x9a;
      }
      TVar2 = (TPMU_KDF_SCHEME)ByteArrayToUint16(*buffer);
      *target = TVar2;
      *buffer = *buffer + 2;
      if (9 < (ushort)((short)TVar2 - 4U)) {
        return 0x83;
      }
      return *(TPM_RC *)(&DAT_0011d300 + (ulong)(ushort)((short)TVar2 - 4U) * 4);
    }
    if (selector == 0x10) {
      return 0;
    }
  }
  else if ((selector == 0x20) || (selector == 0x22)) goto LAB_001083b5;
  return 0x98;
}

Assistant:

TPM_RC
TPMU_KDF_SCHEME_Unmarshal(TPMU_KDF_SCHEME *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_MGF1
        case TPM_ALG_MGF1:
            return TPMS_SCHEME_MGF1_Unmarshal((TPMS_SCHEME_MGF1 *)&(target->mgf1), buffer, size);
#endif // ALG_MGF1
#if         ALG_KDF1_SP800_56A
        case TPM_ALG_KDF1_SP800_56A:
            return TPMS_SCHEME_KDF1_SP800_56A_Unmarshal((TPMS_SCHEME_KDF1_SP800_56A *)&(target->kdf1_sp800_56a), buffer, size);
#endif // ALG_KDF1_SP800_56A
#if         ALG_KDF2
        case TPM_ALG_KDF2:
            return TPMS_SCHEME_KDF2_Unmarshal((TPMS_SCHEME_KDF2 *)&(target->kdf2), buffer, size);
#endif // ALG_KDF2
#if         ALG_KDF1_SP800_108
        case TPM_ALG_KDF1_SP800_108:
            return TPMS_SCHEME_KDF1_SP800_108_Unmarshal((TPMS_SCHEME_KDF1_SP800_108 *)&(target->kdf1_sp800_108), buffer, size);
#endif // ALG_KDF1_SP800_108
        case TPM_ALG_NULL:
            return TPM_RC_SUCCESS;
    }
    return TPM_RC_SELECTOR;
}